

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall bsplib::Rdma::ActionBuf::serialize(ActionBuf *this,A2A *a2a)

{
  int iVar1;
  reference pvVar2;
  size_type sVar3;
  reference __src;
  size_t sVar4;
  size_t sVar5;
  Category local_d4;
  size_t end;
  size_t start;
  TicToc t;
  Action a;
  size_t i;
  int p;
  A2A *a2a_local;
  ActionBuf *this_local;
  
  for (i._4_4_ = 0; iVar1 = A2A::nprocs(a2a), i._4_4_ < iVar1; i._4_4_ = i._4_4_ + 1) {
    serial<unsigned_int>(a2a,i._4_4_,this->m_dummy_bsmp);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_get_buffer_offset,(long)i._4_4_);
    serial<unsigned_long>(a2a,i._4_4_,*pvVar2);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_counts,(long)i._4_4_);
    serial<unsigned_long>(a2a,i._4_4_,*pvVar2);
  }
  for (a.size = 0;
      sVar3 = std::vector<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>::size
                        (&this->m_actions), a.size < sVar3; a.size = a.size + 1) {
    __src = std::vector<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>::operator[]
                      (&this->m_actions,a.size);
    memcpy(&t.m_nbytes,__src,0x38);
    if ((uint)t.m_nbytes == 0) {
      local_d4 = GET;
    }
    else {
      local_d4 = HPGET;
      if ((uint)t.m_nbytes == 1) {
        local_d4 = HPPUT;
      }
    }
    TicToc::TicToc((TicToc *)&start,local_d4,0);
    sVar4 = A2A::send_size(a2a,t.m_nbytes._4_4_);
    serial<unsigned_int>(a2a,t.m_nbytes._4_4_,(uint)t.m_nbytes);
    serial<int>(a2a,t.m_nbytes._4_4_,a.kind);
    serial<int>(a2a,t.m_nbytes._4_4_,a.target_pid);
    serial<int>(a2a,t.m_nbytes._4_4_,a.src_pid);
    serial<unsigned_long>(a2a,t.m_nbytes._4_4_,a._16_8_);
    serial<unsigned_long>(a2a,t.m_nbytes._4_4_,a.src_slot);
    serial<unsigned_long>(a2a,t.m_nbytes._4_4_,a.dst_slot);
    serial<unsigned_long>(a2a,t.m_nbytes._4_4_,a.offset);
    sVar5 = A2A::send_size(a2a,t.m_nbytes._4_4_);
    TicToc::add_bytes((TicToc *)&start,sVar5 - sVar4);
    TicToc::~TicToc((TicToc *)&start);
  }
  return;
}

Assistant:

void Rdma::ActionBuf::serialize( A2A & a2a ) 
{
    for (int p = 0; p < a2a.nprocs(); ++p ) {
        serial( a2a, p, m_dummy_bsmp );
        serial( a2a, p, m_get_buffer_offset[ p ] );
        serial( a2a, p, m_counts[ p ] );
    }

    for (size_t i = 0; i < m_actions.size(); ++i ) 
    {
        Action a = m_actions[i];
#ifdef PROFILE
        TicToc t( a.kind==Action::GET? TicToc::GET:
                  a.kind==Action::HPPUT? TicToc::HPPUT:
                  TicToc::HPGET );
        size_t start = a2a.send_size(a.target_pid);
#endif
        serial( a2a, a.target_pid, unsigned(a.kind) );
        serial( a2a, a.target_pid, a.src_pid );
        serial( a2a, a.target_pid, a.dst_pid );
        serial( a2a, a.target_pid, a.tag );
        serial( a2a, a.target_pid, a.src_slot );
        serial( a2a, a.target_pid, a.dst_slot );
        serial( a2a, a.target_pid, a.offset );
        serial( a2a, a.target_pid, a.size );
#ifdef PROFILE
        size_t end = a2a.send_size(a.target_pid);
        t.add_bytes(end-start);
#endif
    }
}